

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

int main(int argc,char **argv)

{
  char *__s;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  bool bVar1;
  int iVar2;
  size_type sVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar6;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_390;
  undefined1 local_37c [8];
  sockaddr_in address;
  int ret;
  termios newTermios;
  termios origTermios;
  string *category_2;
  iterator __end2;
  iterator __begin2;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *category_1;
  iterator __end6;
  iterator __begin6;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range6;
  value_type local_2a0;
  _Base_ptr local_280;
  undefined1 local_278;
  value_type local_270;
  reference local_250;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *category;
  iterator __end4;
  iterator __begin4;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *__range4;
  undefined1 local_228 [8];
  string arg;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1ff;
  key_equal local_1fe;
  hasher local_1fd;
  int i;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_168;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_128;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a8;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  iterator local_28;
  size_type local_20;
  undefined1 local_18 [8];
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_18 = (undefined1  [8])argv;
  argv_local._0_4_ = argc;
  bVar1 = ssl::initialize();
  if (bVar1) {
    if ((main::categories_abi_cxx11_ == '\0') &&
       (iVar2 = __cxa_guard_acquire(&main::categories_abi_cxx11_), iVar2 != 0)) {
      local_1f0 = &local_1e8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[10],_const_char_(&)[58],_true>
                (local_1f0,(char (*) [10])"--sponsor",
                 (char (*) [58])"Paid promotion, paid referrals and direct advertisements.");
      local_1f0 = &local_1a8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[12],_const_char_(&)[123],_true>
                (local_1f0,(char (*) [12])"--selfpromo",
                 (char (*) [123])
                 "Unpaid or self promotion. Includes sections about merchandise, donations, or information about who they collaborated with."
                );
      local_1f0 = &local_168;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[14],_const_char_(&)[70],_true>
                (local_1f0,(char (*) [14])"--interaction",
                 (char (*) [70])
                 "Reminders to like, subscribe or follow them in the middle of content.");
      local_1f0 = &local_128;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[8],_const_char_(&)[121],_true>
                (local_1f0,(char (*) [8])"--intro",
                 (char (*) [121])
                 "An interval without actual content. Pauses, static frames, repeating animations. Not transitions containing information."
                );
      local_1f0 = &local_e8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[8],_const_char_(&)[79],_true>
                (local_1f0,(char (*) [8])"--outro",
                 (char (*) [79])
                 "Credits or when the YouTube endcards appear. Not conclusions with information.");
      local_1f0 = &local_a8;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[10],_const_char_(&)[140],_true>
                (local_1f0,(char (*) [10])"--preview",
                 (char (*) [140])
                 "Quick recap of previous episodes, or a preview of what\'s coming up later in the current video. Edited together clips, not spoken summaries."
                );
      local_1f0 = &local_68;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<const_char_(&)[17],_const_char_(&)[106],_true>
                (local_1f0,(char (*) [17])"--music_offtopic",
                 (char (*) [106])
                 "Only in music videos. Non-music sections of music videos that aren\'t already covered by another category."
                );
      local_28 = &local_1e8;
      local_20 = 7;
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::allocator(&local_1ff);
      __l._M_len = local_20;
      __l._M_array = local_28;
      std::
      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::unordered_map(&main::categories_abi_cxx11_,__l,0,&local_1fd,&local_1fe,&local_1ff);
      std::
      allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~allocator(&local_1ff);
      local_390 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_28;
      do {
        local_390 = local_390 + -1;
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~pair(local_390);
      } while (local_390 != &local_1e8);
      __cxa_atexit(std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::~unordered_map,&main::categories_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&main::categories_abi_cxx11_);
    }
    for (arg.field_2._12_4_ = 1; (int)arg.field_2._12_4_ < (int)argv_local;
        arg.field_2._12_4_ = arg.field_2._12_4_ + 1) {
      __s = *(char **)((long)local_18 + (long)(int)arg.field_2._12_4_ * 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_228,__s,(allocator<char> *)((long)&__range4 + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range4 + 7));
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_228,"-v");
      if ((bVar1) ||
         (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_228,"--verbose"), bVar1)) {
        s_verbose = true;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_228,"--all-categories");
        if (bVar1) {
          __end4 = std::
                   unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::begin(&main::categories_abi_cxx11_);
          category = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)std::
                        unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::end(&main::categories_abi_cxx11_);
          while (bVar1 = std::__detail::operator!=
                                   (&__end4.
                                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                    ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                      *)&category), bVar1) {
            local_250 = std::__detail::
                        _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                        ::operator*(&__end4);
            std::__cxx11::string::substr((ulong)&local_270,(ulong)local_250);
            pVar6 = std::
                    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::insert(&s_categories_abi_cxx11_,&local_270);
            local_280 = (_Base_ptr)pVar6.first._M_node;
            local_278 = pVar6.second;
            std::__cxx11::string::~string((string *)&local_270);
            std::__detail::
            _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
            ::operator++(&__end4);
          }
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_228,"-a");
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)local_228,"--adblock"), bVar1)) {
            s_adblock = true;
          }
          else {
            sVar3 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::count(&main::categories_abi_cxx11_,(key_type *)local_228);
            if (sVar3 == 0) {
              printf("Usage: %s [-a|--adblock] [-v|--verbose] [--all-categories]\n",
                     *(char **)local_18);
              puts(
                  "You may also specify which categories you want to skip, defaults to just sponsors:"
                  );
              __end6 = std::
                       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::begin(&main::categories_abi_cxx11_);
              category_1 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)std::
                              unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              ::end(&main::categories_abi_cxx11_);
              while (bVar1 = std::__detail::operator!=
                                       (&__end6.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                        ,(_Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
                                          *)&category_1), bVar1) {
                std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                ::operator*(&__end6);
                uVar4 = std::__cxx11::string::c_str();
                uVar5 = std::__cxx11::string::c_str();
                printf("  %s: %s\n",uVar4,uVar5);
                std::__detail::
                _Node_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                ::operator++(&__end6);
              }
              puts("\n--adblock is basically untested and might not work, hence not on by default");
              exit(0x16);
            }
            std::__cxx11::string::substr((ulong)&local_2a0,(ulong)local_228);
            std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&s_categories_abi_cxx11_,&local_2a0);
            std::__cxx11::string::~string((string *)&local_2a0);
          }
        }
      }
      std::__cxx11::string::~string((string *)local_228);
    }
    bVar1 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty(&s_categories_abi_cxx11_);
    if (!bVar1) {
      printf("  Skipping these categories: ");
      __end2 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&s_categories_abi_cxx11_);
      category_2 = (string *)
                   std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end(&s_categories_abi_cxx11_);
      while (bVar1 = std::operator!=(&__end2,(_Self *)&category_2), bVar1) {
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator*(&__end2);
        uVar4 = std::__cxx11::string::c_str();
        printf("%s ",uVar4);
        std::
        _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator++(&__end2);
      }
      puts("");
    }
    signal(2,signalHandler);
    signal(0xf,signalHandler);
    signal(3,signalHandler);
    tcgetattr(0,(termios *)&newTermios.c_ispeed);
    memcpy(address.sin_zero + 4,&newTermios.c_ispeed,0x3c);
    newTermios.c_oflag = newTermios.c_oflag & 0xfffffff5;
    tcsetattr(0,0,(termios *)(address.sin_zero + 4));
    address.sin_zero[0] = '\0';
    address.sin_zero[1] = '\0';
    address.sin_zero[2] = '\0';
    address.sin_zero[3] = '\0';
    while ((s_running & 1U) != 0) {
      s_currentPosition = -1.0;
      nextSegmentStart = -1.0;
      s_lastPositionFetched = -1.0;
      std::__cxx11::string::operator=((string *)&currentVideo_abi_cxx11_,"");
      std::__cxx11::string::operator=((string *)cc::mediaSession_abi_cxx11_,"");
      std::__cxx11::string::operator=((string *)cc::dest_abi_cxx11_,"");
      if (address.sin_zero._0_4_ != 0) {
        puts("Disconnected, sleeping and re-connecting");
        sleep(10);
      }
      memset(local_37c,0,0x10);
      bVar1 = mdns::findChromecast((sockaddr_in *)local_37c);
      if (!bVar1) {
        address.sin_zero[0] = '\x02';
        address.sin_zero[1] = '\0';
        address.sin_zero[2] = '\0';
        address.sin_zero[3] = '\0';
        break;
      }
      printf("\x1b[?25l");
      std::__cxx11::string::operator=((string *)&s_currentStatus_abi_cxx11_,"Connecting...");
      address.sin_zero._0_4_ = loop((sockaddr_in *)local_37c);
    }
    printf("\x1b[?25h");
    tcsetattr(0,0,(termios *)&newTermios.c_ispeed);
    argv_local._4_1_ = address.sin_zero[0];
    argv_local._5_1_ = address.sin_zero[1];
    argv_local._6_1_ = address.sin_zero[2];
    argv_local._7_1_ = address.sin_zero[3];
  }
  else {
    argv_local._4_4_ = 1;
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
    if (!ssl::initialize()) {
        return 1;
    }
    static std::unordered_map<std::string, std::string> categories = {
        { "--sponsor", "Paid promotion, paid referrals and direct advertisements." },
        { "--selfpromo", "Unpaid or self promotion. Includes sections about merchandise, donations, or information about who they collaborated with." },
        { "--interaction", "Reminders to like, subscribe or follow them in the middle of content." },
        { "--intro", "An interval without actual content. Pauses, static frames, repeating animations. Not transitions containing information." },
        { "--outro", "Credits or when the YouTube endcards appear. Not conclusions with information." },
        { "--preview", "Quick recap of previous episodes, or a preview of what's coming up later in the current video. Edited together clips, not spoken summaries." },
        { "--music_offtopic", "Only in music videos. Non-music sections of music videos that aren't already covered by another category." },
    };
    for (int i=1; i<argc; i++) {
        const std::string arg = argv[i];
        if (arg == "-v" || arg == "--verbose") {
            s_verbose = true;
        } else if (arg == "--all-categories") {
            for (const std::pair<const std::string, std::string> &category : categories) {
                s_categories.insert(category.first.substr(2));
            }
        } else if (arg == "-a" || arg == "--adblock") {
            s_adblock = true;
        } else if (categories.count(arg)) {
            s_categories.insert(arg.substr(2));
        } else {
            printf("Usage: %s [-a|--adblock] [-v|--verbose] [--all-categories]\n", argv[0]);
            puts("You may also specify which categories you want to skip, defaults to just sponsors:");
            for (const std::pair<const std::string, std::string> &category : categories) {
                printf("  %s: %s\n", category.first.c_str(), category.second.c_str());
            }
            puts("\n--adblock is basically untested and might not work, hence not on by default");
            exit(EINVAL);
        }
    }
    if (!s_categories.empty()) {
        printf("  Skipping these categories: ");
        for (const std::string &category : s_categories) {
            printf("%s ", category.c_str());
        }
        puts("");
    }
    signal(SIGINT, &signalHandler);
    signal(SIGTERM, &signalHandler);
    signal(SIGQUIT, &signalHandler);

    termios origTermios;
    tcgetattr(STDIN_FILENO, &origTermios);

    termios newTermios = origTermios;
    newTermios.c_lflag &= ~(ECHO | ICANON);
    tcsetattr(STDIN_FILENO, TCSANOW, &newTermios);

    int ret = 0;
    while (s_running) {
        s_currentPosition = -1.;
        nextSegmentStart = -1.;
        s_lastPositionFetched = -1;
        currentVideo = "";
        cc::mediaSession = "";
        cc::dest = "";

        if (ret != 0) {
            puts("Disconnected, sleeping and re-connecting");
            sleep(10);
        }
        sockaddr_in address{};


        if (!mdns::findChromecast(&address)) {
            ret = ENOENT;
            break;
        }

        // hide cursor
        printf("\033[?25l");
        s_currentStatus = "Connecting...";
        ret = loop(address);
    }

    printf("\033[?25h"); // re-enable cursor
    tcsetattr(STDIN_FILENO, TCSANOW, &origTermios);

    return ret;
}